

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSAttribute.cpp
# Opt level: O1

bool __thiscall OSAttribute::peekValue(OSAttribute *this,ByteString *value)

{
  undefined8 uVar1;
  size_t sVar2;
  bool *__src;
  uchar *puVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  long lVar6;
  
  switch(this->attributeType) {
  case BOOL:
    ByteString::resize(value,1);
    puVar3 = ByteString::operator[](value,0);
    __src = &this->boolValue;
    break;
  case ULONG:
    ByteString::resize(value,8);
    puVar3 = ByteString::operator[](value,0);
    __src = (bool *)&this->ulongValue;
    break;
  case BYTESTR:
    sVar2 = ByteString::size(&this->byteStrValue);
    ByteString::resize(value,sVar2);
    puVar3 = ByteString::operator[](value,0);
    __src = (bool *)ByteString::const_byte_str(&this->byteStrValue);
    break;
  case MECHSET:
    ByteString::resize(value,(this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_node_count
                             << 3);
    p_Var4 = (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(this->mechSetValue)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 == p_Var5) {
      return true;
    }
    lVar6 = 0;
    do {
      uVar1 = *(undefined8 *)(p_Var4 + 1);
      puVar3 = ByteString::operator[](value,0);
      *(undefined8 *)(puVar3 + lVar6) = uVar1;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      lVar6 = lVar6 + 8;
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    return true;
  default:
    return false;
  }
  sVar2 = ByteString::size(value);
  memcpy(puVar3,__src,sVar2);
  return true;
}

Assistant:

bool OSAttribute::peekValue(ByteString& value) const
{
	size_t counter = 0;
	CK_MECHANISM_TYPE mech;

	switch (attributeType)
	{
		case BOOL:
			value.resize(sizeof(boolValue));
			memcpy(&value[0], &boolValue, value.size());
			return true;

		case ULONG:
			value.resize(sizeof(ulongValue));
			memcpy(&value[0], &ulongValue, value.size());
			return true;

		case BYTESTR:
			value.resize(byteStrValue.size());
			memcpy(&value[0], byteStrValue.const_byte_str(), value.size());
			return true;

		case MECHSET:
			value.resize(mechSetValue.size() * sizeof(mech));
			for (std::set<CK_MECHANISM_TYPE>::const_iterator i = mechSetValue.begin(); i != mechSetValue.end(); ++i)
			{
				mech = *i;
				memcpy(&value[0] + counter * sizeof(mech), &mech, sizeof(mech));
				counter++;
			}
			return true;

		case ATTRMAP:
			return false;

		default:
			return false;
	}
}